

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeOpen(sqlite3_vtab *pVTab,sqlite3_vtab_cursor **ppCursor)

{
  sqlite3_vtab_cursor *__s;
  RtreeCursor *pCsr;
  Rtree *pRtree;
  int rc;
  sqlite3_vtab_cursor **ppCursor_local;
  sqlite3_vtab *pVTab_local;
  
  pRtree._4_4_ = 7;
  __s = (sqlite3_vtab_cursor *)sqlite3_malloc64(0x128);
  if (__s != (sqlite3_vtab_cursor *)0x0) {
    memset(__s,0,0x128);
    __s->pVtab = pVTab;
    pRtree._4_4_ = 0;
    pVTab[3].nRef = pVTab[3].nRef + 1;
  }
  *ppCursor = __s;
  return pRtree._4_4_;
}

Assistant:

static int rtreeOpen(sqlite3_vtab *pVTab, sqlite3_vtab_cursor **ppCursor){
  int rc = SQLITE_NOMEM;
  Rtree *pRtree = (Rtree *)pVTab;
  RtreeCursor *pCsr;

  pCsr = (RtreeCursor *)sqlite3_malloc64(sizeof(RtreeCursor));
  if( pCsr ){
    memset(pCsr, 0, sizeof(RtreeCursor));
    pCsr->base.pVtab = pVTab;
    rc = SQLITE_OK;
    pRtree->nCursor++;
  }
  *ppCursor = (sqlite3_vtab_cursor *)pCsr;

  return rc;
}